

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::ConsoleReporter::testRunEnded(ConsoleReporter *this,TestRunStats *_testRunStats)

{
  ostream *this_00;
  TestRunStats *_testRunStats_local;
  ConsoleReporter *this_local;
  
  if ((this->m_atLeastOneTestCasePrinted & 1U) != 0) {
    printTotalsDivider(this);
  }
  printTotals(this,&_testRunStats->totals);
  this_00 = std::operator<<((this->super_StreamingReporterBase).stream,"\n");
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  StreamingReporterBase::testRunEnded(&this->super_StreamingReporterBase,_testRunStats);
  return;
}

Assistant:

virtual void testRunEnded( TestRunStats const& _testRunStats ) {
            if( m_atLeastOneTestCasePrinted )
                printTotalsDivider();
            printTotals( _testRunStats.totals );
            stream << "\n" << std::endl;
            StreamingReporterBase::testRunEnded( _testRunStats );
        }